

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall kratos::MultipleDriverVisitor::~MultipleDriverVisitor(MultipleDriverVisitor *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b4da0;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* gen) override {
        auto var_names = gen->get_vars();
        for (auto const& name : var_names) {
            auto const& var = gen->get_var(name);
            check_var(var.get());
        }

        auto port_names = gen->get_port_names();
        for (auto const& name : port_names) {
            auto const& port = gen->get_port(name);
            check_var(port.get());
        }
    }